

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynEnumDefinition * ParseEnumDefinition(ParseContext *ctx)

{
  Lexeme *begin;
  IntrusiveList<SynConstant> values_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  Lexeme *pLVar4;
  Lexeme *pLVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Lexeme *end;
  SynBase *value;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  SynEnumDefinition *this;
  char *msg;
  InplaceStr IVar6;
  SynIdentifier *local_58;
  IntrusiveList<SynConstant> values;
  undefined4 extraout_var_04;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_enum) {
    ctx->currentLexeme = begin + 1;
    bVar1 = anon_unknown.dwarf_147a9::CheckAt(ctx,lex_string,"ERROR: enum name expected");
    if (bVar1) {
      IVar6 = ParseContext::Consume(ctx);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      local_58 = (SynIdentifier *)CONCAT44(extraout_var,iVar2);
      pLVar4 = ParseContext::Previous(ctx);
      pLVar5 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier(local_58,pLVar4,pLVar5,IVar6);
    }
    else {
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
      local_58 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar2);
      SynIdentifier::SynIdentifier(local_58,(InplaceStr)ZEXT816(0));
    }
    anon_unknown.dwarf_147a9::CheckConsume(ctx,lex_ofigure,"ERROR: \'{\' not found after enum name")
    ;
    values.head = (SynConstant *)0x0;
    values.tail = (SynConstant *)0x0;
    while( true ) {
      if (values.head == (SynConstant *)0x0) {
        msg = "ERROR: enumeration name expected after \'{\'";
      }
      else {
        msg = "ERROR: enumeration name expected after \',\'";
      }
      bVar1 = anon_unknown.dwarf_147a9::CheckAt(ctx,lex_string,msg);
      if (!bVar1) break;
      pLVar4 = ctx->currentLexeme;
      IVar6 = ParseContext::Consume(ctx);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pLVar5 = ParseContext::Previous(ctx);
      end = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier
                ((SynIdentifier *)CONCAT44(extraout_var_01,iVar2),pLVar5,end,IVar6);
      if (ctx->currentLexeme->type == lex_set) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
        value = ParseTernaryExpr(ctx);
        if (value == (SynBase *)0x0) {
          anon_unknown.dwarf_147a9::Report
                    (ctx,ctx->currentLexeme,"ERROR: expression not found after \'=\'");
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          value = (SynBase *)CONCAT44(extraout_var_02,iVar3);
          pLVar5 = ParseContext::Previous(ctx);
          SynError::SynError((SynError *)value,begin,pLVar5);
        }
      }
      else {
        value = (SynBase *)0x0;
      }
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pLVar5 = ParseContext::Previous(ctx);
      SynConstant::SynConstant
                ((SynConstant *)CONCAT44(extraout_var_03,iVar3),pLVar4,pLVar5,
                 (SynIdentifier *)CONCAT44(extraout_var_01,iVar2),value);
      IntrusiveList<SynConstant>::push_back(&values,(SynConstant *)CONCAT44(extraout_var_03,iVar3));
      if (ctx->currentLexeme->type != lex_comma) break;
      ctx->currentLexeme = ctx->currentLexeme + 1;
    }
    anon_unknown.dwarf_147a9::CheckConsume
              (ctx,lex_cfigure,"ERROR: \'}\' not found after enum definition");
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    this = (SynEnumDefinition *)CONCAT44(extraout_var_04,iVar2);
    pLVar4 = ParseContext::Previous(ctx);
    values_00.tail = values.tail;
    values_00.head = values.head;
    SynEnumDefinition::SynEnumDefinition(this,begin,pLVar4,local_58,values_00);
  }
  else {
    this = (SynEnumDefinition *)0x0;
  }
  return this;
}

Assistant:

SynEnumDefinition* ParseEnumDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_enum))
	{
		SynIdentifier *nameIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: enum name expected"))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else
		{
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after enum name");

		IntrusiveList<SynConstant> values;

		do
		{
			if(values.empty())
			{
				if(!CheckAt(ctx, lex_string, "ERROR: enumeration name expected after '{'"))
					break;
			}
			else
			{
				if(!CheckAt(ctx, lex_string, "ERROR: enumeration name expected after ','"))
					break;
			}

			Lexeme *pos = ctx.currentLexeme;

			InplaceStr name = ctx.Consume();
			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

			SynBase *value = NULL;

			if(ctx.Consume(lex_set))
			{
				value = ParseTernaryExpr(ctx);

				if(!value)
				{
					Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

					value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
				}
			}

			values.push_back(new (ctx.get<SynConstant>()) SynConstant(pos, ctx.Previous(), nameIdentifier, value));
		}
		while(ctx.Consume(lex_comma));

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after enum definition");

		return new (ctx.get<SynEnumDefinition>()) SynEnumDefinition(start, ctx.Previous(), nameIdentifier, values);
	}

	return NULL;
}